

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  TokenType TVar7;
  undefined4 uVar8;
  ulong uVar9;
  Token *pTVar10;
  ulong uVar11;
  optional<wabt::Token> *poVar12;
  Token local_58;
  
  if ((this->tokens_).tokens._M_elems[(this->tokens_).i].
      super__Optional_base<wabt::Token,_true,_true>._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged == false) {
    WastLexer::GetToken(&local_58,this->lexer_);
    uVar11 = (ulong)(this->tokens_).i;
    uVar9 = uVar11 ^ 1;
    if ((this->tokens_).tokens._M_elems[uVar9].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) {
      __assert_fail("!tokens[!i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
    }
    poVar12 = (this->tokens_).tokens._M_elems + uVar9;
    *(char **)((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x30) =
         local_58.field_2.text_._M_str;
    *(char **)((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x38) =
         local_58.field_2.literal_.text._M_str;
    *(undefined8 *)
     ((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x20) = local_58._32_8_;
    *(size_t *)
     ((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x28) =
         local_58.field_2.text_._M_len;
    (((anon_union_16_2_ecfd7102_for_Location_1 *)
     ((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x10))->field_1).
    offset = (size_t)local_58.loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x18) =
         local_58.loc.field_1._8_8_;
    *(size_t *)
     &(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc =
         local_58.loc.filename._M_len;
    *(char **)((long)&(poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 8) =
         local_58.loc.filename._M_str;
    (poVar12->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_engaged = true;
    if ((this->tokens_).tokens._M_elems[uVar11].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      (this->tokens_).i = SUB81(uVar9,0);
    }
  }
  pTVar10 = TokenQueue::front(&this->tokens_);
  pcVar1 = (pTVar10->loc).filename._M_str;
  sVar2 = (pTVar10->loc).field_1.field_1.offset;
  uVar3 = *(undefined8 *)((long)&(pTVar10->loc).field_1 + 8);
  TVar7 = pTVar10->token_type_;
  uVar8 = *(undefined4 *)&pTVar10->field_0x24;
  sVar4 = (pTVar10->field_2).text_._M_len;
  pcVar5 = (pTVar10->field_2).text_._M_str;
  pcVar6 = (pTVar10->field_2).literal_.text._M_str;
  (__return_storage_ptr__->loc).filename._M_len = (pTVar10->loc).filename._M_len;
  (__return_storage_ptr__->loc).filename._M_str = pcVar1;
  (__return_storage_ptr__->loc).field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar3;
  __return_storage_ptr__->token_type_ = TVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar8;
  (__return_storage_ptr__->field_2).text_._M_len = sVar4;
  (__return_storage_ptr__->field_2).text_._M_str = pcVar5;
  (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar6;
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken());
  }
  return tokens_.front();
}